

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool __thiscall
llama_model_loader::load_all_data
          (llama_model_loader *this,ggml_context *ctx,llama_buf_map *bufs,llama_mlocks *lmlocks,
          llama_progress_callback progress_callback,void *progress_callback_user_data)

{
  undefined4 *puVar1;
  ggml_backend_t pgVar2;
  byte bVar3;
  bool bVar4;
  undefined8 uVar5;
  mapped_type *ppgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_type sVar9;
  void *pvVar10;
  unsigned_long *puVar11;
  reference ppgVar12;
  reference ppvVar13;
  no_init<unsigned_char> *pnVar14;
  runtime_error *prVar15;
  reference ppgVar16;
  reference ppgVar17;
  size_type sVar18;
  reference pvVar19;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  code *in_R8;
  undefined8 in_R9;
  pair<ggml_tensor_*,_bool> pVar20;
  value_type *mapping_1;
  value_type *mmap_used_1;
  uint32_t idx;
  pair<ggml_tensor_*,_bool> result;
  future<std::pair<ggml_tensor_*,_bool>_> *future;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  *__range1_2;
  bool validation_failed;
  ggml_backend_buffer *buf;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *__range1_1;
  ggml_backend_event *event;
  iterator __end1;
  iterator __begin1;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> *__range1;
  size_t read_iteration;
  size_t bytes_read;
  value_type *file;
  value_type *mmap_used;
  value_type *lmlock;
  uint8_t *data;
  ggml_backend_buffer_t buf_mmap;
  value_type *mapping;
  size_t n_size;
  llama_tensor_weight *weight;
  ggml_tensor *cur;
  ggml_backend_t upload_backend;
  size_t buffer_idx;
  vector<void_*,_std::allocator<void_*>_> host_ptrs;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> events;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> host_buffers;
  size_t buffer_size;
  size_t n_buffers;
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  validation_result;
  vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> read_buf;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  future<std::pair<ggml_tensor_*,_bool>_> *in_stack_fffffffffffffbe8;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *in_stack_fffffffffffffbf0;
  future<std::pair<ggml_tensor_*,_bool>_> *in_stack_fffffffffffffbf8;
  vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
  *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc40;
  llama_model_loader *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffcb0;
  anon_class_40_5_c25c2117 *in_stack_fffffffffffffcb8;
  float local_31c;
  float local_304;
  uint local_27c;
  __normal_iterator<std::future<std::pair<ggml_tensor_*,_bool>_>_*,_std::vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>_>
  local_248;
  undefined1 *local_240;
  byte local_231;
  ggml_backend_buffer *local_230;
  ggml_backend_buffer **local_228;
  __normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
  local_220;
  undefined1 *local_218;
  ggml_backend_event *local_210;
  ggml_backend_event **local_208;
  __normal_iterator<ggml_backend_event_**,_std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>_>
  local_200;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> *local_1f8;
  undefined1 local_1e9;
  string local_1e8 [32];
  unsigned_long local_1c8;
  unsigned_long local_1c0;
  ulong local_1b8;
  undefined4 *local_1b0;
  ulong local_1a8;
  reference local_190;
  unsigned_long local_188;
  reference local_180;
  reference local_178;
  undefined4 *local_170;
  long local_168;
  ulong local_160;
  long local_148;
  uint local_140;
  uint local_13c;
  mapped_type local_138;
  reference local_130;
  ulong local_128;
  undefined4 local_11c;
  llama_tensor_weight *local_118;
  undefined4 *local_110;
  undefined4 local_108;
  undefined8 local_f0;
  undefined1 *local_e8;
  vector<void_*,_std::allocator<void_*>_> *local_e0;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> *local_d8;
  ggml_backend_t local_d0;
  ulong local_c8;
  vector<void_*,_std::allocator<void_*>_> local_c0;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> local_a8;
  undefined1 local_90 [24];
  unsigned_long local_78 [2];
  undefined1 local_68 [48];
  undefined8 local_38;
  code *local_30;
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  if (*(long *)(in_RDI + 0x128) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
               ,0x37a,"GGML_ASSERT(%s) failed","size_data != 0 && \"call init_mappings() first\"");
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::vector
            ((vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> *)0x45236f);
  std::
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ::vector((vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
            *)0x45237c);
  local_78[1] = 4;
  local_78[0] = 0x100000;
  std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::vector
            ((vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *)0x4523a9);
  std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>::vector
            ((vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> *)0x4523be);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)0x4523d3);
  local_c8 = 0;
  local_f0 = local_20;
  local_e8 = local_90;
  local_e0 = &local_c0;
  local_d8 = &local_a8;
  local_d0 = load_all_data::anon_class_40_5_c25c2117::operator()
                       (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (local_d0 != (ggml_backend_t)0x0) {
    uVar5 = ggml_backend_get_device(local_d0);
    uVar5 = ggml_backend_dev_name(uVar5);
    local_108 = 0;
    ppgVar6 = std::
              unordered_map<unsigned_int,_ggml_backend_buffer_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>_>
              ::at((unordered_map<unsigned_int,_ggml_backend_buffer_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                   (key_type *)in_stack_fffffffffffffbd8);
    uVar7 = ggml_backend_buffer_get_type(*ppgVar6);
    uVar7 = ggml_backend_buft_name(uVar7);
    uVar8 = ggml_backend_name(local_d0);
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                       "%s: using async uploads for device %s, buffer type %s, backend %s\n",
                       "load_all_data",uVar5,uVar7,uVar8);
  }
  for (local_110 = (undefined4 *)ggml_get_first_tensor(local_18); local_110 != (undefined4 *)0x0;
      local_110 = (undefined4 *)ggml_get_next_tensor(local_18,local_110)) {
    ggml_get_name(local_110);
    local_118 = get_weight(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    if (local_118 != (llama_tensor_weight *)0x0) {
      if (local_30 != (code *)0x0) {
        local_304 = (float)*(ulong *)(in_RDI + 0x120);
        local_31c = (float)*(ulong *)(in_RDI + 0x128);
        bVar3 = (*local_30)(local_304 / local_31c,local_38);
        if ((bVar3 & 1) == 0) {
          local_1 = 0;
          goto LAB_004534bf;
        }
      }
      local_128 = ggml_nbytes(local_110);
      if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
        local_190 = std::
                    vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                    ::at((vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                         (size_type)in_stack_fffffffffffffbd8);
        bVar3 = ggml_backend_buffer_is_host(*(undefined8 *)(local_110 + 2));
        if ((bVar3 & 1) == 0) {
          if (local_d0 == (ggml_backend_t)0x0) {
            std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::resize
                      (in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8);
            std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
                      ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x452e2d);
            llama_file::seek((llama_file *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                             (size_t)in_stack_fffffffffffffbd8,0);
            std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
                      ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x452e52);
            std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::data
                      ((vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> *)
                       0x452e67);
            llama_file::read_raw
                      ((llama_file *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       in_stack_fffffffffffffbd8,0x452e7f);
            in_stack_fffffffffffffc58 = local_110;
            pnVar14 = std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                      ::data((vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                              *)0x452e9e);
            ggml_backend_tensor_set(in_stack_fffffffffffffc58,pnVar14,0,local_128);
            if ((*(byte *)(in_RDI + 0x21) & 1) != 0) {
              in_stack_fffffffffffffc50 = *local_110;
              pnVar14 = std::
                        vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::
                        data((vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                              *)0x452ee9);
              bVar3 = ggml_validate_row_data(in_stack_fffffffffffffc50,pnVar14,local_128);
              in_stack_fffffffffffffc54 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc54);
              if ((bVar3 & 1) == 0) {
                local_1e9 = 1;
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                uVar5 = ggml_get_name(local_110);
                format_abi_cxx11_((char *)local_1e8,"tensor \'%s\' has invalid data",uVar5);
                std::runtime_error::runtime_error(prVar15,local_1e8);
                local_1e9 = 0;
                __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
            }
          }
          else {
            std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
                      ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x452c4f);
            llama_file::seek((llama_file *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                             (size_t)in_stack_fffffffffffffbd8,0);
            for (local_1b8 = 0; local_1b8 < local_128; local_1b8 = local_1c0 + local_1b8) {
              local_1c8 = local_128 - local_1b8;
              puVar11 = std::min<unsigned_long>(local_78,&local_1c8);
              local_1c0 = *puVar11;
              ppgVar12 = std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>::
                         operator[](&local_a8,local_c8);
              ggml_backend_event_synchronize(*ppgVar12);
              std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
                        ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x452d02);
              std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_c0,local_c8);
              llama_file::read_raw
                        ((llama_file *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0)
                         ,in_stack_fffffffffffffbd8,0x452d37);
              pgVar2 = local_d0;
              puVar1 = local_110;
              ppvVar13 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                                   (&local_c0,local_c8);
              ggml_backend_tensor_set_async(pgVar2,puVar1,*ppvVar13,local_1b8,local_1c0);
              ppgVar12 = std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>::
                         operator[](&local_a8,local_c8);
              ggml_backend_event_record(*ppgVar12,local_d0);
              local_c8 = local_c8 + 1 & 3;
            }
          }
        }
        else {
          std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
                    ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x452b4e);
          llama_file::seek((llama_file *)
                           CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                           (size_t)in_stack_fffffffffffffbd8,0);
          std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
                    ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x452b73);
          llama_file::read_raw
                    ((llama_file *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                     in_stack_fffffffffffffbd8,0x452b92);
          if ((*(byte *)(in_RDI + 0x21) & 1) != 0) {
            local_1b0 = local_110;
            local_1a8 = local_128;
            std::
            async<llama_model_loader::load_all_data(ggml_context*,std::unordered_map<unsigned_int,ggml_backend_buffer*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ggml_backend_buffer*>>>&,std::vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>*,bool(*)(float,void*),void*)::__2>
                      ((launch)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                       (type *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
            std::
            vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
            ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                      ((vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
                        *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
            std::future<std::pair<ggml_tensor_*,_bool>_>::~future
                      ((future<std::pair<ggml_tensor_*,_bool>_> *)0x452c06);
          }
        }
      }
      else {
        local_130 = std::
                    vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                    ::at((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                         (size_type)in_stack_fffffffffffffbd8);
        local_138 = (mapped_type)0x0;
        local_13c = (uint)local_118->idx;
        sVar9 = std::
                unordered_map<unsigned_int,_ggml_backend_buffer_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>_>
                ::count((unordered_map<unsigned_int,_ggml_backend_buffer_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>_>
                         *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                        (key_type *)in_stack_fffffffffffffbd8);
        if (sVar9 != 0) {
          local_140 = (uint)local_118->idx;
          ppgVar6 = std::
                    unordered_map<unsigned_int,_ggml_backend_buffer_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>_>
                    ::at((unordered_map<unsigned_int,_ggml_backend_buffer_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>_>
                          *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                         (key_type *)in_stack_fffffffffffffbd8);
          local_138 = *ppgVar6;
        }
        std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                  ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x45282d);
        pvVar10 = llama_mmap::addr((llama_mmap *)0x452835);
        local_148 = (long)pvVar10 + local_118->offs;
        if ((*(byte *)(in_RDI + 0x21) & 1) != 0) {
          local_170 = local_110;
          local_160 = local_128;
          local_168 = local_148;
          std::
          async<llama_model_loader::load_all_data(ggml_context*,std::unordered_map<unsigned_int,ggml_backend_buffer*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ggml_backend_buffer*>>>&,std::vector<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>,std::allocator<std::unique_ptr<llama_mlock,std::default_delete<llama_mlock>>>>*,bool(*)(float,void*),void*)::__1>
                    ((launch)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                     (type *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          std::
          vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
          ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                    ((vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
                      *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          std::future<std::pair<ggml_tensor_*,_bool>_>::~future
                    ((future<std::pair<ggml_tensor_*,_bool>_> *)0x4528dd);
        }
        if ((local_138 == (mapped_type)0x0) && (*(long *)(local_110 + 0x3e) == 0)) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
                     ,0x3f5,"GGML_ASSERT(%s) failed","buf_mmap || cur->data");
        }
        if ((local_138 == (mapped_type)0x0) || (*(long *)(local_110 + 0x3e) != 0)) {
          ggml_backend_tensor_set(local_110,local_148,0,local_128);
        }
        else {
          ggml_backend_tensor_alloc(local_138,local_110,local_148);
          if (local_28 != 0) {
            local_178 = std::
                        vector<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                        ::at((vector<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                             (size_type)in_stack_fffffffffffffbd8);
            std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>::operator->
                      ((unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_> *)0x4529d5);
            llama_mlock::grow_to
                      ((llama_mlock *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       (size_t)in_stack_fffffffffffffbd8);
          }
          local_180 = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    *)(in_RDI + 0x130),(ulong)local_118->idx);
          puVar11 = std::min<unsigned_long>(&local_180->first,&local_118->offs);
          local_180->first = *puVar11;
          local_188 = local_118->offs + local_128;
          puVar11 = std::max<unsigned_long>(&local_180->second,&local_188);
          local_180->second = *puVar11;
        }
      }
      *(ulong *)(in_RDI + 0x120) = local_128 + *(long *)(in_RDI + 0x120);
    }
  }
  local_1f8 = &local_a8;
  local_200._M_current =
       (ggml_backend_event **)
       std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>::begin
                 ((vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> *)
                  in_stack_fffffffffffffbd8);
  local_208 = (ggml_backend_event **)
              std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>::end
                        ((vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> *)
                         in_stack_fffffffffffffbd8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<ggml_backend_event_**,_std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                            (__normal_iterator<ggml_backend_event_**,_std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>_>
                             *)in_stack_fffffffffffffbd8), bVar4) {
    ppgVar16 = __gnu_cxx::
               __normal_iterator<ggml_backend_event_**,_std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>_>
               ::operator*(&local_200);
    local_210 = *ppgVar16;
    ggml_backend_event_synchronize(local_210);
    ggml_backend_event_free(local_210);
    __gnu_cxx::
    __normal_iterator<ggml_backend_event_**,_std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>_>
    ::operator++(&local_200);
  }
  local_218 = local_90;
  local_220._M_current =
       (ggml_backend_buffer **)
       std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::begin
                 (in_stack_fffffffffffffbd8);
  local_228 = (ggml_backend_buffer **)
              std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::end
                        (in_stack_fffffffffffffbd8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                            (__normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
                             *)in_stack_fffffffffffffbd8), bVar4) {
    ppgVar17 = __gnu_cxx::
               __normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
               ::operator*(&local_220);
    local_230 = *ppgVar17;
    ggml_backend_buffer_free(local_230);
    __gnu_cxx::
    __normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
    ::operator++(&local_220);
  }
  ggml_backend_free(local_d0);
  local_231 = 0;
  local_240 = local_68;
  local_248._M_current =
       (future<std::pair<ggml_tensor_*,_bool>_> *)
       std::
       vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
       ::begin((vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
                *)in_stack_fffffffffffffbd8);
  std::
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ::end((vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
         *)in_stack_fffffffffffffbd8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::future<std::pair<ggml_tensor_*,_bool>_>_*,_std::vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                            (__normal_iterator<std::future<std::pair<ggml_tensor_*,_bool>_>_*,_std::vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>_>
                             *)in_stack_fffffffffffffbd8), bVar4) {
    __gnu_cxx::
    __normal_iterator<std::future<std::pair<ggml_tensor_*,_bool>_>_*,_std::vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>_>
    ::operator*(&local_248);
    pVar20 = std::future<std::pair<ggml_tensor_*,_bool>_>::get(in_stack_fffffffffffffbf8);
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar5 = ggml_get_name(pVar20.first);
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: tensor \'%s\' has invalid data\n","load_all_data"
                         ,uVar5);
      local_231 = 1;
    }
    __gnu_cxx::
    __normal_iterator<std::future<std::pair<ggml_tensor_*,_bool>_>_*,_std::vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>_>
    ::operator++(&local_248);
  }
  if ((local_231 & 1) != 0) {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,"found tensors with invalid data");
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(ulong *)(in_RDI + 0x128) <= *(ulong *)(in_RDI + 0x120)) {
    if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
      for (local_27c = 0;
          sVar18 = std::
                   vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                   ::size((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                           *)(in_RDI + 0x48)), local_27c < sVar18; local_27c = local_27c + 1) {
        pvVar19 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::at((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                       (size_type)in_stack_fffffffffffffbd8);
        std::
        vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
        ::at((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
             (size_type)in_stack_fffffffffffffbd8);
        std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                  ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x4533cc);
        llama_mmap::unmap_fragment
                  ((llama_mmap *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                   (size_t)in_stack_fffffffffffffbd8,0x4533e3);
        if (pvVar19->second != 0) {
          std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                    ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x453401);
          in_stack_fffffffffffffbf0 =
               (vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *)
               pvVar19->second;
          std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                    ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x453424);
          llama_mmap::size((llama_mmap *)0x45342c);
          llama_mmap::unmap_fragment
                    ((llama_mmap *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                     (size_t)in_stack_fffffffffffffbd8,0x453447);
        }
      }
    }
    if (local_30 != (code *)0x0) {
      local_1 = (*local_30)(0x3f800000,local_38);
      local_1 = local_1 & 1;
      goto LAB_004534bf;
    }
  }
  local_1 = 1;
LAB_004534bf:
  local_11c = 1;
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffbf0);
  std::vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>::~vector
            ((vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> *)
             in_stack_fffffffffffffbf0);
  std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::~vector
            (in_stack_fffffffffffffbf0);
  std::
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ::~vector((vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
             *)in_stack_fffffffffffffbf0);
  std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::~vector
            ((vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> *)
             in_stack_fffffffffffffbf0);
  return (bool)(local_1 & 1);
}

Assistant:

bool llama_model_loader::load_all_data(
        struct ggml_context * ctx,
        llama_buf_map & bufs,
        llama_mlocks * lmlocks,
        llama_progress_callback progress_callback,
        void * progress_callback_user_data) {
    GGML_ASSERT(size_data != 0 && "call init_mappings() first");

    std::vector<no_init<uint8_t>> read_buf;
    std::vector<std::future<std::pair<ggml_tensor *, bool>>> validation_result;

    // 4 staging buffers for async uploads, each sized 1MB seems to be a good default for single NVMe drives.
    // NVMe raid configurations might require more / larger buffers.
    constexpr size_t n_buffers = 4;
    constexpr size_t buffer_size = 1 * 1024 * 1024; // 1MB

    std::vector<ggml_backend_buffer_t> host_buffers;
    std::vector<ggml_backend_event_t> events;
    std::vector<void *> host_ptrs;
    size_t buffer_idx = 0; // buffer to use for async loads
    ggml_backend_t upload_backend = [&](const char * func) -> ggml_backend_t {
        if (use_mmap || check_tensors) {
            return nullptr;
        }
        // When not using mmaped io use async uploads from pinned memory to GPU memory.
        // First determine if the backend supports the necessary features for async uploads.
        auto * buf = bufs.count(0) ? bufs.at(0) : nullptr;
        if (!buf) {
            LLAMA_LOG_DEBUG("%s: no buffer found for async uploads\n", func);
            return nullptr;
        }

        auto * buft = ggml_backend_buffer_get_type(buf);
        auto * dev = ggml_backend_buft_get_device(buft);
        if (!dev) {
            LLAMA_LOG_DEBUG("%s: no device found for buffer type %s for async uploads\n", func,
                ggml_backend_buft_name(buft));
            return nullptr;
        }

        if (buft != ggml_backend_dev_buffer_type(dev)) {
            LLAMA_LOG_DEBUG("%s: buffer type %s is not the default buffer type for device %s for async uploads\n", func,
                ggml_backend_buft_name(buft), ggml_backend_dev_name(dev));
            return nullptr;
        }

        ggml_backend_dev_props props;
        ggml_backend_dev_get_props(dev, &props);
        if (!props.caps.async || !props.caps.host_buffer || !props.caps.events) {
            LLAMA_LOG_DEBUG("%s: device %s does not support async, host buffers or events\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        auto * host_buft = ggml_backend_dev_host_buffer_type(dev);
        if (!host_buft) {
            LLAMA_LOG_DEBUG("%s: no host buffer type found for device %s\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        // If the backend is supported, create pinned memory buffers and events for synchronisation.
        for (size_t idx = 0; idx < n_buffers; ++idx) {
            auto * buf = ggml_backend_buft_alloc_buffer(host_buft, buffer_size);
            if (!buf) {
                LLAMA_LOG_DEBUG("%s: failed to allocate host buffer for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            host_buffers.emplace_back(buf);
            host_ptrs.emplace_back(ggml_backend_buffer_get_base(buf));

            auto * event = ggml_backend_event_new(dev);
            if (!event) {
                LLAMA_LOG_DEBUG("%s: failed to create event for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            events.emplace_back(event);
        }

        ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
        if (!backend) {
            LLAMA_LOG_DEBUG("%s: failed to initialize backend for device %s for async uploads\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        return backend;
    }(__func__);

    if (upload_backend) {
        LLAMA_LOG_DEBUG("%s: using async uploads for device %s, buffer type %s, backend %s\n", __func__,
            ggml_backend_dev_name(ggml_backend_get_device(upload_backend)),
            ggml_backend_buft_name(ggml_backend_buffer_get_type(bufs.at(0))),
            ggml_backend_name(upload_backend));
    }

    for (struct ggml_tensor * cur = ggml_get_first_tensor(ctx); cur != NULL; cur = ggml_get_next_tensor(ctx, cur)) {
        const auto * weight = get_weight(ggml_get_name(cur));
        if (weight == nullptr) {
            // this can happen with split experts models
            continue;
        }

        if (progress_callback) {
            if (!progress_callback((float) size_done / size_data, progress_callback_user_data)) {
                return false;
            }
        }

        size_t n_size = ggml_nbytes(cur);

        if (use_mmap) {
            const auto & mapping = mappings.at(weight->idx);
            ggml_backend_buffer_t buf_mmap = nullptr;
            if (bufs.count(weight->idx)) {
                buf_mmap = bufs.at(weight->idx);
            }
            uint8_t * data = (uint8_t *) mapping->addr() + weight->offs;

            if (check_tensors) {
                validation_result.emplace_back(std::async(std::launch::async, [cur, data, n_size] {
                    return std::make_pair(cur, ggml_validate_row_data(cur->type, data, n_size));
                }));
            }

            GGML_ASSERT(buf_mmap || cur->data); // either we have a buffer to allocate the tensor in, or it is already allocated
            if (buf_mmap && cur->data == nullptr) {
                ggml_backend_tensor_alloc(buf_mmap, cur, data);
                if (lmlocks) {
                    const auto & lmlock = lmlocks->at(weight->idx);
                    lmlock->grow_to(weight->offs + n_size);
                }

                auto & mmap_used = mmaps_used[weight->idx];
                mmap_used.first  = std::min(mmap_used.first,  weight->offs);
                mmap_used.second = std::max(mmap_used.second, weight->offs + n_size);
            } else {
                ggml_backend_tensor_set(cur, data, 0, n_size);
            }
        } else {
            const auto & file = files.at(weight->idx);
            if (ggml_backend_buffer_is_host(cur->buffer)) {
                file->seek(weight->offs, SEEK_SET);
                file->read_raw(cur->data, n_size);
                if (check_tensors) {
                    validation_result.emplace_back(std::async(std::launch::async, [cur, n_size] {
                        return std::make_pair(cur, ggml_validate_row_data(cur->type, cur->data, n_size));
                    }));
                }
            } else {
                // If upload_backend is valid load the tensor in chunks to pinned memory and upload the buffers asynchronously to the GPU.
                if (upload_backend) {
                    file->seek(weight->offs, SEEK_SET);

                    size_t bytes_read = 0;

                    while (bytes_read < n_size) {
                        size_t read_iteration = std::min<size_t>(buffer_size, n_size - bytes_read);

                        ggml_backend_event_synchronize(events[buffer_idx]);
                        file->read_raw(host_ptrs[buffer_idx], read_iteration);
                        ggml_backend_tensor_set_async(upload_backend, cur, host_ptrs[buffer_idx], bytes_read, read_iteration);
                        ggml_backend_event_record(events[buffer_idx], upload_backend);

                        bytes_read += read_iteration;
                        ++buffer_idx;
                        buffer_idx %= n_buffers;
                    }
                } else {
                    read_buf.resize(n_size);
                    file->seek(weight->offs, SEEK_SET);
                    file->read_raw(read_buf.data(), n_size);
                    ggml_backend_tensor_set(cur, read_buf.data(), 0, n_size);
                    if (check_tensors && !ggml_validate_row_data(cur->type, read_buf.data(), n_size)) {
                        throw std::runtime_error(format("tensor '%s' has invalid data", ggml_get_name(cur)));
                    }
                }
            }
        }

        size_done += n_size;
    }

    // free temporary resources used for async uploads
    for (auto * event : events) {
        ggml_backend_event_synchronize(event);
        ggml_backend_event_free(event);
    }
    for (auto * buf : host_buffers) {
        ggml_backend_buffer_free(buf);
    }
    ggml_backend_free(upload_backend);

    // check validation results
    bool validation_failed = false;
    for (auto & future : validation_result) {
        auto result = future.get();
        if (!result.second) {
            LLAMA_LOG_ERROR("%s: tensor '%s' has invalid data\n", __func__, ggml_get_name(result.first));
            validation_failed = true;
        }
    }
    if (validation_failed) {
        throw std::runtime_error("found tensors with invalid data");
    }

    // check if this is the last call and do final cleanup
    if (size_done >= size_data) {
        // unmap offloaded tensors and metadata
        if (use_mmap) {
            for (uint32_t idx = 0; idx < mappings.size(); idx++) {
                const auto & mmap_used = mmaps_used.at(idx);
                auto & mapping = mappings.at(idx);
                mapping->unmap_fragment(0, mmap_used.first);
                if (mmap_used.second != 0) {
                    mapping->unmap_fragment(mmap_used.second, mapping->size());
                }
            }
        }
        if (progress_callback) {
            // Even though the model is done loading, we still honor
            // cancellation since we need to free allocations.
            return progress_callback(1.0f, progress_callback_user_data);
        }
    }

    return true;
}